

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_semacheck2.c
# Opt level: O3

void visit_variable_decl(gvisitor_t *self,gnode_variable_decl_t *node)

{
  uint32_t *puVar1;
  gnode_n env;
  gtoken_t gVar2;
  long *plVar3;
  gnode_t *node_00;
  _Bool _Var4;
  uint32_t uVar5;
  symboltable_t *table;
  int *piVar6;
  short sVar7;
  int iVar8;
  size_t sVar9;
  gnode_t *node_01;
  ulong uVar10;
  gnode_t *node_02;
  
  plVar3 = *self->data;
  if ((plVar3 == (long *)0x0) || (*plVar3 == 0)) {
    node_02 = (gnode_t *)0x0;
  }
  else {
    node_02 = *(gnode_t **)(plVar3[2] + -8 + *plVar3 * 8);
  }
  table = symtable_from_node(node_02);
  if (node->decls == (gnode_r *)0x0) {
    sVar9 = 0;
  }
  else {
    sVar9 = node->decls->n;
  }
  env = node_02->tag;
  check_access_storage_specifiers(self,&node->base,env,node->access,node->storage);
  if (sVar9 != 0) {
    uVar10 = 0;
    do {
      if (uVar10 < node->decls->n) {
        node_01 = node->decls->p[uVar10];
      }
      else {
        node_01 = (gnode_t *)0x0;
      }
      *(gnode_t **)(node_01 + 1) = node_02;
      node_00 = *(gnode_t **)&node_01[1].token.colno;
      if (node_00 == (gnode_t *)0x0) {
LAB_0011df63:
        if (env == NODE_CLASS_DECL) {
          if (*(char *)((long)&node_01[1].token.length + 3) == '\0') {
            gVar2 = node->storage;
            if (gVar2 == TOK_KEY_STATIC) {
              *(int *)&node_02[2].field_0xc = *(int *)&node_02[2].field_0xc + 1;
            }
            else {
              node_02[2].block_length = node_02[2].block_length + 1;
            }
            piVar6 = *(int **)&node_02[1].token.bytes;
            if (piVar6 == (int *)0x0) {
              sVar7 = 0;
            }
            else {
              if (*piVar6 != 10) {
                return;
              }
              iVar8 = 0;
              do {
                iVar8 = iVar8 + piVar6[(ulong)(gVar2 == TOK_KEY_STATIC) + 0x26];
                sVar7 = (short)iVar8;
                piVar6 = *(int **)(piVar6 + 0x1a);
              } while (piVar6 != (int *)0x0);
            }
            puVar1 = &node_01[1].token.length;
            *(short *)puVar1 = (short)*puVar1 + sVar7;
          }
        }
        else if (env == NODE_FUNCTION_DECL) {
          _Var4 = symboltable_insert(table,*(char **)&node_01[1].block_length,node_01);
          if (_Var4) {
            uVar5 = symboltable_local_index(table);
            *(short *)&node_01[1].token.length = (short)uVar5;
          }
          else {
            report_error(self,GRAVITY_ERROR_SEMANTIC,node_01,"Identifier %s redeclared.",
                         *(undefined8 *)&node_01[1].block_length);
          }
        }
      }
      else {
        gvisit(self,node_00);
        piVar6 = *(int **)&node_01[1].token.colno;
        if ((piVar6 == (int *)0x0) || (*piVar6 != 7)) goto LAB_0011df63;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != sVar9);
  }
  return;
}

Assistant:

static void visit_variable_decl (gvisitor_t *self, gnode_variable_decl_t *node) {
    gnode_t         *top = TOP_DECLARATION();
    symboltable_t   *symtable = symtable_from_node(top);
    size_t          count = gnode_array_size(node->decls);
    gnode_n         env = NODE_TAG(top);
    bool            env_is_function = (env == NODE_FUNCTION_DECL);

    // check if optional access and storage specifiers make sense in current context
    check_access_storage_specifiers(self, (gnode_t *)node, env, node->access, node->storage);

    // loop to check each individual declaration
    for (size_t i=0; i<count; ++i) {
        gnode_var_t *p = (gnode_var_t *)gnode_array_get(node->decls, i);
        DEBUG_SEMA2("visit_variable_decl %s", p->identifier);

        // set enclosing environment
        p->env = top;

        // visit expression first in order to prevent var a = a
        // variable with a initial value (or with a getter/setter)
        if (p->expr) visit(p->expr);
        if (NODE_ISA(p->expr, NODE_ENUM_DECL)) continue;
        
//        // check for manifest type
//        if (p->annotation_type) {
//            // struct gnode_var_t was modified with
//            // // untagged union, if no type is declared then this union is NULL otherwise
//            // union {
//            //     const char          *annotation_type;   // optional annotation type
//            //     gnode_class_decl_t  *class_type;        // class type (set in semacheck2 if annotation_type is not NULL)
//            // };
//            gnode_t *class_type = lookup_identifier(self, p->annotation_type, NULL);
//            if (!class_type) {REPORT_WARNING(p, "Unable to find type %s.", p->annotation_type);}
//        //     if (!NODE_ISA(class_type, NODE_CLASS_DECL)) {REPORT_ERROR(p, "Unable to set non class type %s.", p->annotation_type); continue;}
//        //     p->class_type = (gnode_class_decl_t *)class_type;
//        }
        
        if (env_is_function) {
            // local variable defined inside a function
            if (!symboltable_insert(symtable, p->identifier, (void *)p)) {
                REPORT_ERROR(p, "Identifier %s redeclared.", p->identifier);
                continue;
            }
            SET_LOCAL_INDEX(p, symtable);
            DEBUG_SEMA2("Local:%s index:%d", p->identifier, p->index);
        } else if (env == NODE_CLASS_DECL) {
            if (p->iscomputed) continue;
            
            // variable defined inside a class => property
            gnode_class_decl_t *c = (gnode_class_decl_t *)top;

            // compute new ivar index
            (node->storage == TOK_KEY_STATIC) ? ++c->nsvar : ++c->nivar;

            // super class is a static information so I can solve the fragile class problem at compilation time
            gnode_class_decl_t *super = (gnode_class_decl_t *)c->superclass;
            if (super && !NODE_ISA(super, NODE_CLASS_DECL)) return;
            
            uint32_t n2 = 0;
            while (super) {
                n2 += (node->storage == TOK_KEY_STATIC) ? super->nsvar : super->nivar;
                super = (gnode_class_decl_t *)super->superclass;
            }

            p->index += n2;
            DEBUG_SEMA2("Class: %s property:%s index:%d (static %d)", c->identifier, p->identifier, p->index, (node->storage == TOK_KEY_STATIC));
        }
    }
}